

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O3

int64_t __thiscall indk::NeuralNet::getSignalBufferSize(NeuralNet *this)

{
  int64_t iVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  int64_t iVar4;
  long lVar5;
  bool bVar6;
  
  p_Var2 = (this->Neurons)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->Neurons)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 == p_Var3) {
    iVar4 = -1;
  }
  else {
    iVar4 = -1;
    do {
      iVar1 = Neuron::getSignalBufferSize(*(Neuron **)(p_Var2 + 2));
      lVar5 = iVar4;
      if (iVar1 < iVar4) {
        lVar5 = iVar1;
      }
      bVar6 = iVar4 == -1;
      iVar4 = lVar5;
      if (bVar6) {
        iVar4 = iVar1;
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return iVar4;
}

Assistant:

int64_t indk::NeuralNet::getSignalBufferSize() {
    int64_t size = -1;
    for (auto &n: Neurons) {
        auto nbsize = n.second -> getSignalBufferSize();
        if (size != -1 && nbsize >= size) continue;
        size = nbsize;
    }
    return size;
}